

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTests.cpp
# Opt level: O1

void testDealloc(void *ptr)

{
  int *piVar1;
  bool *pbVar2;
  long lVar3;
  bool local_19;
  int *local_18;
  
  if (ptr != (void *)0x0) {
    piVar1 = (int *)((long)ptr + -0x80);
    local_18 = piVar1;
    pbVar2 = SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U>::find
                       (&activePoiners,(unsigned_long *)&local_18);
    if ((pbVar2 == (bool *)0x0) || (*pbVar2 == false)) {
      printf("pointer was not allocated (%p)\n",piVar1);
      abort();
    }
    local_19 = false;
    local_18 = piVar1;
    SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U>::insert
              (&activePoiners,(unsigned_long *)&local_18,&local_19);
    testTotalMemoryFree = testTotalMemoryFree + 1;
    testTotalMemoryUsed = testTotalMemoryUsed - *piVar1;
    lVar3 = -0x7c;
    do {
      if (*(char *)((long)ptr + lVar3) != -0x12) {
        __assert_fail("((unsigned char*)ptr)[i] == 0xee",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/UnitTests.cpp"
                      ,0x89,"void testDealloc(void *)");
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    operator_delete__(piVar1);
  }
  return;
}

Assistant:

void testDealloc(void* ptr)
{
	if(!ptr)
		return;

	ptr = (char*)ptr - 128;

	bool* active = activePoiners.find(uintptr_t(ptr));

	if(!active || !*active)
	{
		printf("pointer was not allocated (%p)\n", ptr);
		abort();
	}

	activePoiners.insert(uintptr_t(ptr), 0);

	testTotalMemoryFree++;
	testTotalMemoryUsed -= *(unsigned*)ptr;

	for(unsigned i = sizeof(unsigned); i < 128; i++)
		assert(((unsigned char*)ptr)[i] == 0xee);

#ifdef ALLOC_TOP_DOWN
	VirtualFree((char*)ptr, 0, MEM_RELEASE);
#else
	delete[] (char*)ptr;
#endif
}